

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int mllr_mat(float32 *****out_A,float32 ****out_B,char *var_fn,vector_t ***mean,vector_t ***wt_mean,
            float32 ***wt_dcount,uint32 gau_begin,int32 *cb2mllr,uint32 mllr_mult,uint32 mllr_add,
            float32 varfloor,uint32 n_mgau,uint32 n_stream,uint32 n_density,uint32 n_mllr_class,
            uint32 *veclen)

{
  int iVar1;
  int32 iVar2;
  cmd_ln_t *cmdln;
  long lVar3;
  float32 **ppfVar4;
  uint local_d8;
  uint local_d4;
  uint32 l_1;
  uint32 k_1;
  uint32 j_1;
  uint32 i_1;
  vector_t ****fullvar;
  int32 len;
  int32 mc;
  int32 m;
  uint32 q;
  uint32 p;
  uint32 s;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 *veclen_rd;
  uint32 local_88;
  uint32 n_density_rd;
  uint32 n_stream_rd;
  uint32 n_mgau_rd;
  float32 *tmean;
  float local_70;
  float32 wt_dcount_var_mean;
  float32 wt_dcount_var;
  float32 wt_mean_var;
  float32 ****regr;
  float32 *****regl;
  float32 ***B;
  float32 ****A;
  vector_t ***var;
  float32 ***pppfStack_38;
  float32 varfloor_local;
  float32 ***wt_dcount_local;
  vector_t ***wt_mean_local;
  vector_t ***mean_local;
  char *var_fn_local;
  float32 ****out_B_local;
  float32 *****out_A_local;
  
  A = (float32 ****)0x0;
  B = (float32 ***)0x0;
  regl = (float32 *****)0x0;
  regr = (float32 ****)0x0;
  _wt_dcount_var = (float32 ****)0x0;
  _n_stream_rd = (vector_t)0x0;
  _j = (uint32 *)0x0;
  fullvar._0_4_ = 0;
  var._4_4_ = varfloor;
  pppfStack_38 = wt_dcount;
  wt_dcount_local = (float32 ***)wt_mean;
  wt_mean_local = mean;
  mean_local = (vector_t ***)var_fn;
  var_fn_local = (char *)out_B;
  out_B_local = (float32 ****)out_A;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x7f,"\n");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0x80," ---- mllr_solve(): Conventional MLLR method\n");
  cmdln = cmd_ln_get();
  lVar3 = cmd_ln_int_r(cmdln,"-fullvar");
  if ((int)lVar3 == 0) {
    iVar1 = s3gau_read((char *)mean_local,(vector_t ****)&A,&n_density_rd,&local_88,
                       (uint32 *)((long)&veclen_rd + 4),(uint32 **)&j);
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,0xa3,"Couldn\'t read %s",mean_local);
      exit(1);
    }
  }
  else {
    iVar1 = s3gau_read_full((char *)mean_local,(vector_t *****)&j_1,&n_density_rd,&local_88,
                            (uint32 *)((long)&veclen_rd + 4),(uint32 **)&j);
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
              ,0x8e,"Couldn\'t read %s",mean_local);
      exit(1);
    }
    A = (float32 ****)gauden_alloc_param(n_density_rd,local_88,veclen_rd._4_4_,_j);
    for (k_1 = 0; k_1 < n_density_rd; k_1 = k_1 + 1) {
      for (l_1 = 0; l_1 < local_88; l_1 = l_1 + 1) {
        for (local_d4 = 0; local_d4 < veclen_rd._4_4_; local_d4 = local_d4 + 1) {
          for (local_d8 = 0; local_d8 < _j[l_1]; local_d8 = local_d8 + 1) {
            ((vector_t ***)A)[k_1][l_1][local_d4][local_d8] =
                 _j_1[k_1][l_1][local_d4][local_d8][local_d8];
          }
        }
      }
    }
    gauden_free_param_full(_j_1);
  }
  if (n_mgau != n_density_rd) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0xa8,"n_mgau mismatch (%u : %u)\n",(ulong)n_mgau,(ulong)n_density_rd);
    exit(1);
  }
  if (n_stream != local_88) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0xab,"n_stream mismatch (%u : %u)\n",(ulong)n_stream,(ulong)local_88);
    exit(1);
  }
  if (n_density == veclen_rd._4_4_) {
    for (q = 0; q < n_stream; q = q + 1) {
      if (veclen[q] != _j[q]) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                ,0xb3,"vector length of stream %u (== %u) != prior length (== %u)\n",(ulong)q,
                (ulong)_j[q],veclen[q]);
        exit(1);
      }
    }
    ckd_free(_j);
    _j = (uint32 *)0x0;
    for (k = 0; k < n_mgau; k = k + 1) {
      for (l = 0; l < n_stream; l = l + 1) {
        for (s = 0; s < n_density; s = s + 1) {
          for (p = 0; p < veclen[l]; p = p + 1) {
            if (0.0 < (float)A[k][l][s][p]) {
              if ((float)var._4_4_ <= (float)A[k][l][s][p]) {
                A[k][l][s][p] = (float32)(1.0 / (float)A[k][l][s][p]);
              }
              else {
                A[k][l][s][p] = (float32)(1.0 / (float)var._4_4_);
              }
            }
            else {
              A[k][l][s][p] = 0.5;
            }
          }
        }
      }
    }
    fprintf(_stderr,"\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0xd0," ---- A. Accum regl, regr\n");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0xd1," No classes %d, no. stream %d\n",(ulong)n_mllr_class,(ulong)n_stream);
    regr = (float32 ****)
           __ckd_calloc_2d__((ulong)n_mllr_class,(ulong)n_stream,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                             ,0xd4);
    _wt_dcount_var =
         (float32 ****)
         __ckd_calloc_2d__((ulong)n_mllr_class,(ulong)n_stream,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                           ,0xd6);
    for (k = 0; k < n_mllr_class; k = k + 1) {
      for (l = 0; l < n_stream; l = l + 1) {
        fullvar._0_4_ = veclen[l];
        ppfVar4 = (float32 **)
                  __ckd_calloc_3d__((long)(int)(uint)fullvar,(long)(int)((uint)fullvar + 1),
                                    (long)(int)((uint)fullvar + 1),4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                    ,0xdb);
        regr[k][l] = ppfVar4;
        ppfVar4 = (float32 **)
                  __ckd_calloc_2d__((long)(int)(uint)fullvar,(long)(int)((uint)fullvar + 1),4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
                                    ,0xdc);
        _wt_dcount_var[k][l] = ppfVar4;
      }
    }
    for (k = gau_begin; k < n_mgau; k = k + 1) {
      fullvar._4_4_ = cb2mllr[k];
      if (-1 < fullvar._4_4_) {
        for (l = 0; l < n_stream; l = l + 1) {
          fullvar._0_4_ = veclen[l];
          for (s = 0; s < n_density; s = s + 1) {
            if (0.0 < (float)pppfStack_38[k][l][s]) {
              _n_stream_rd = wt_mean_local[k][l][s];
              for (p = 0; p < (uint)fullvar; p = p + 1) {
                wt_dcount_var_mean =
                     (float32)(*(float *)(*(long *)(wt_dcount_local[k][l] + (ulong)s * 2) +
                                         (ulong)p * 4) * (float)A[k][l][s][p]);
                local_70 = (float)pppfStack_38[k][l][s] * (float)A[k][l][s][p];
                for (m = 0; (uint)m < (uint)fullvar; m = m + 1) {
                  tmean._4_4_ = local_70 * _n_stream_rd[(uint)m];
                  for (mc = m; (uint)mc < (uint)fullvar; mc = mc + 1) {
                    *(float *)(*(long *)(regr[fullvar._4_4_][l][p] + (ulong)(uint)m * 2) +
                              (ulong)(uint)mc * 4) =
                         tmean._4_4_ * _n_stream_rd[(uint)mc] +
                         *(float *)(*(long *)(regr[fullvar._4_4_][l][p] + (ulong)(uint)m * 2) +
                                   (ulong)(uint)mc * 4);
                  }
                  *(float *)(*(long *)(regr[fullvar._4_4_][l][p] + (ulong)(uint)m * 2) +
                            (long)(int)(uint)fullvar * 4) =
                       tmean._4_4_ +
                       *(float *)(*(long *)(regr[fullvar._4_4_][l][p] + (ulong)(uint)m * 2) +
                                 (long)(int)(uint)fullvar * 4);
                  _wt_dcount_var[fullvar._4_4_][l][p][(uint)m] =
                       (float32)((float)wt_dcount_var_mean * _n_stream_rd[(uint)m] +
                                (float)_wt_dcount_var[fullvar._4_4_][l][p][(uint)m]);
                }
                *(float *)(*(long *)(regr[fullvar._4_4_][l][p] + (long)(int)(uint)fullvar * 2) +
                          (long)(int)(uint)fullvar * 4) =
                     local_70 +
                     *(float *)(*(long *)(regr[fullvar._4_4_][l][p] + (long)(int)(uint)fullvar * 2)
                               + (long)(int)(uint)fullvar * 4);
                _wt_dcount_var[fullvar._4_4_][l][p][(int)(uint)fullvar] =
                     (float32)((float)wt_dcount_var_mean +
                              (float)_wt_dcount_var[fullvar._4_4_][l][p][(int)(uint)fullvar]);
              }
            }
          }
        }
      }
    }
    gauden_free_param(wt_mean_local);
    gauden_free_param((vector_t ***)wt_dcount_local);
    ckd_free_3d(pppfStack_38);
    for (len = 0; (uint)len < n_mllr_class; len = len + 1) {
      for (l = 0; l < n_stream; l = l + 1) {
        for (p = 0; p < veclen[l]; p = p + 1) {
          for (m = 0; iVar1 = m, (uint)m <= veclen[l]; m = m + 1) {
            while (mc = iVar1 + 1, (uint)mc <= veclen[l]) {
              *(undefined4 *)(*(long *)(regr[len][l][p] + (ulong)(uint)mc * 2) + (ulong)(uint)m * 4)
                   = *(undefined4 *)
                      (*(long *)(regr[len][l][p] + (ulong)(uint)m * 2) + (ulong)(uint)mc * 4);
              iVar1 = mc;
            }
          }
        }
      }
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x119," ---- B. Compute MLLR matrices (A,B)\n");
    iVar2 = compute_mllr((float32 *****)regr,_wt_dcount_var,veclen,n_mllr_class,n_stream,mllr_mult,
                         mllr_add,(float32 *****)&B,(float32 ****)&regl);
    if (iVar2 == 0) {
      free_mllr_reg((float32 *****)regr,_wt_dcount_var,n_mllr_class,n_stream);
      *out_B_local = B;
      *(float32 ******)var_fn_local = regl;
      return 0;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
            ,0x123,"MLLR computation failed\n");
    exit(1);
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_solve/main.c"
          ,0xae,"n_density mismatch (%u : %u)\n",(ulong)n_density,(ulong)veclen_rd._4_4_);
  exit(1);
}

Assistant:

int 
mllr_mat(float32 	*****out_A, 
      	float32 	****out_B, 
  	const char 	*var_fn, 
  	vector_t 	***mean, 
        vector_t        ***wt_mean,             /* read from bw accum */
	float32         ***wt_dcount,           /* read from bw accum */
  	uint32 		gau_begin, 
  	int32 		*cb2mllr, 
  	uint32 		mllr_mult,		
  	uint32 		mllr_add,		
  	float32		varfloor, 
  	uint32 		n_mgau, 
  	uint32 		n_stream, 
  	uint32 		n_density, 
  	uint32 		n_mllr_class, 
  	const uint32 	*veclen) 


{
      vector_t 	***var  	= NULL; 
      float32 	****A  		= NULL;		
      float32 	***B   		= NULL; 	

      float32 	*****regl  	= NULL; 
      float32 	****regr   	= NULL; 

      float32     wt_mean_var;
      float32     wt_dcount_var;
      float32     wt_dcount_var_mean;

      float32	*tmean		= NULL; 
      uint32 	n_mgau_rd; 
      uint32 	n_stream_rd; 
      uint32 	n_density_rd; 

      uint32    *veclen_rd	= NULL; 

      uint32 i, j, k, l, s, p , q;
      int32 m, mc;
      int32 len=0;

      /*      uint32 	i, j, k, l, p, q, s; 
	      int32	m, mc, mi; */

      E_INFO("\n");
      E_INFO(" ---- mllr_solve(): Conventional MLLR method\n"); 

      if (cmd_ln_int32("-fullvar")) {
	  /* Extract diagonals to solve MLLR (we are not doing
	     variance adaptation, yet) */
	  vector_t ****fullvar;
	  uint32 i, j, k, l;

	  if (s3gau_read_full(var_fn, 
			      &fullvar, 
			      &n_mgau_rd, 
			      &n_stream_rd, 
			      &n_density_rd, 
			      &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
	  var = gauden_alloc_param(n_mgau_rd,
				   n_stream_rd,
				   n_density_rd,
				   veclen_rd);
	  for (i = 0; i < n_mgau_rd; ++i)
	      for (j = 0; j < n_stream_rd; ++j)
		  for (k = 0; k < n_density_rd; ++k)
		      for (l = 0; l < veclen_rd[j]; ++l)
			  var[i][j][k][l] =
			      fullvar[i][j][k][l][l];
	  gauden_free_param_full(fullvar);
      }
      else {
	  if (s3gau_read(var_fn, 
			 &var, 
			 &n_mgau_rd, 
			 &n_stream_rd, 
			 &n_density_rd, 
			 &veclen_rd) != S3_SUCCESS) { 
	      E_FATAL("Couldn't read %s", var_fn); 
	  } 
      }

      if (n_mgau != n_mgau_rd) { 
  	E_FATAL("n_mgau mismatch (%u : %u)\n",n_mgau,n_mgau_rd); 
      } 
      if (n_stream != n_stream_rd) { 
  	E_FATAL("n_stream mismatch (%u : %u)\n",n_stream,n_stream_rd); 
      } 
      if (n_density != n_density_rd) { 
  	E_FATAL("n_density mismatch (%u : %u)\n",n_density,n_density_rd); 
      } 
      for (s = 0; s < n_stream; s++) { 
  	if (veclen[s] != veclen_rd[s]) { 
  	    E_FATAL("vector length of stream %u (== %u) " 
  		    "!= prior length (== %u)\n", s, veclen_rd[s], veclen[s]); 
  	} 
      } 
      ckd_free((void *)veclen_rd); 
      veclen_rd = NULL; 


      /* Invert variances. */
      for (i = 0; i < n_mgau; i++) { 
          for (j = 0; j < n_stream; j++) { 
              for (k = 0; k < n_density; k++) { 
                  for (l = 0; l < veclen[j]; l++) { 
                      if (var[i][j][k][l] <= 0.) { 
  			var[i][j][k][l] = VAR_CONST;	
  		    } 
  		    else if (var[i][j][k][l] < varfloor) { 
  			var[i][j][k][l] = 1. / varfloor; 
  		    } 
  		    else { 
  		        var[i][j][k][l] = 1. / var[i][j][k][l]; 
  		    } 
                  } 
              } 
          } 
      } 


      fprintf(stderr,"\n"); 

      E_INFO(" ---- A. Accum regl, regr\n"); 
      E_INFO(" No classes %d, no. stream %d\n",n_mllr_class,n_stream);

      /* Legetter's set of G matrices, one per dimension per class. */
      regl = (float32 *****)ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 ***)); 
      /* Legetter's Z matrices, one per class. */
      regr = (float32 ****) ckd_calloc_2d(n_mllr_class, n_stream, sizeof(float32 **)); 
      
      for (i = 0; i < n_mllr_class; i++) { 
          for (j = 0; j < n_stream; j++) { 
              len = veclen[j]; 
              regl[i][j] = (float32 ***)ckd_calloc_3d(len, len+1, len+1, sizeof(float32)); 
              regr[i][j] = (float32 **) ckd_calloc_2d(len, len+1, sizeof(float32)); 
          } 
      } 
      
      /*      E_INFO(" Checking\n");*/

      for (i = gau_begin; i < n_mgau; i++) { 
        mc = cb2mllr[i]; 
	if (mc < 0) continue;	/* skip */

        for (j = 0; j < n_stream; j++) { 
	  len=veclen[j];

	  for (k = 0; k < n_density; k++) { 
	    if (wt_dcount[i][j][k] > 0.) { 
	      tmean = mean[i][j][k]; 
	      for (l = 0; l < len; l++) { 
		wt_mean_var   = wt_mean[i][j][k][l] * var[i][j][k][l]; 
		wt_dcount_var = wt_dcount[i][j][k]  * var[i][j][k][l]; 
		
		for (p = 0; p < len; p++) { 
		  wt_dcount_var_mean = wt_dcount_var * tmean[p]; 
		  for (q = p; q < len; q++) { 
		    /* This is g(l)_{pq} = sum_r(v_{ii}(r) d_{pq}(r))*/
		    /* or in other words sum(likelihood * invvar * outer(mean, mean)) */
		    regl[mc][j][l][p][q] += (float32) (wt_dcount_var_mean * tmean[q]); 
		  } 
		  /* G corresponding to extended element of q. */
		  regl[mc][j][l][p][len] += (float32)(wt_dcount_var_mean); 
		  /* This is z_{lp} = sum(likelihood * invvar * obs * mean_p) */
		  regr[mc][j][l][p] += (float32)(wt_mean_var * tmean[p]); 
		} 
		/* G corresponding to extended element of p and q. */
		/* Question: what about regl[mc][j][l][len][0..len]? */
		/* Answer: G(l) is symmetric, so we already calculated them. */
		regl[mc][j][l][len][len] += (float32)wt_dcount_var; 
		/* Z corresponding to extended element of p. */
		regr[mc][j][l][len] += (float32)(wt_mean_var); 
	      } 
	    } 
	  } 
	} 
      }

      gauden_free_param(mean); 
      gauden_free_param(wt_mean); 
      ckd_free_3d((void ***)wt_dcount); 

      /* Fill in the lower triangular part of regl. */
      for (m = 0; m < n_mllr_class; m++) { 
        for (j = 0; j < n_stream; j++) { 
	  for (l = 0; l < veclen[j]; l++) { 
	    for (p = 0; p <= veclen[j]; p++) { 
	      for (q = p+1; q <= veclen[j]; q++) { 
		regl[m][j][l][q][p] = regl[m][j][l][p][q]; 
	      } 
	    } 
	  } 
        } 
      } 

      E_INFO(" ---- B. Compute MLLR matrices (A,B)\n"); 
      if(compute_mllr(regl, 
  		    regr, 
  		    veclen, 
  		    n_mllr_class, 
  		    n_stream, 
  		    mllr_mult, 
  		    mllr_add, 
  		    &A, 
  		    &B) != S3_SUCCESS) {  
  	E_FATAL("MLLR computation failed\n"); 
      } 

      free_mllr_reg(regl,regr, n_mllr_class, n_stream); 

      *out_A = A; 
      *out_B = B; 

      return S3_SUCCESS; 
}